

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>
pbrt::Tokenizer::CreateFromString
          (string *str,function<void_(const_char_*,_const_pbrt::FileLoc_*)> *errorCallback)

{
  __uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true> in_RDI;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_stack_00000050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000058;
  
  std::
  make_unique<pbrt::Tokenizer,std::__cxx11::string,std::function<void(char_const*,pbrt::FileLoc_const*)>>
            (in_stack_00000058,in_stack_00000050);
  return (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
         (tuple<pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>)
         in_RDI.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>._M_t.
         super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
         super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Tokenizer> Tokenizer::CreateFromString(
    std::string str, std::function<void(const char *, const FileLoc *)> errorCallback) {
    return std::make_unique<Tokenizer>(std::move(str), std::move(errorCallback));
}